

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void gvr::anon_unknown_3::readASCIIElement(streambuf *in,char *out,int n)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  bool bVar2;
  int i;
  int c;
  undefined4 local_1c;
  undefined4 local_18;
  
  local_18 = std::streambuf::sgetc();
  while( true ) {
    bVar2 = false;
    if (local_18 != -1) {
      iVar1 = isspace(local_18);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_18 = std::streambuf::snextc();
  }
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_18 != -1) {
      iVar1 = isspace(local_18);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    if (local_1c < in_EDX + -1) {
      *(char *)(in_RSI + local_1c) = (char)local_18;
      local_1c = local_1c + 1;
    }
    local_18 = std::streambuf::snextc();
  }
  *(undefined1 *)(in_RSI + local_1c) = 0;
  return;
}

Assistant:

void readASCIIElement(std::streambuf *in, char *out, int n)
{
  // eat white spaces

  int c=in->sgetc();

  while (c != EOF && isspace(c))
  {
    c=in->snextc();
  }

  // read until next white space or end of file

  n--;
  int i=0;

  while (c != EOF && !isspace(c))
  {
    if (i < n)
    {
      out[i++]=static_cast<char>(c);
    }

    c=in->snextc();
  }

  out[i]='\0';
}